

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParsePubidLiteral(xmlParserCtxtPtr ctxt)

{
  xmlParserInputState xVar1;
  xmlParserCtxtPtr pxVar2;
  int iVar3;
  xmlChar *tmp;
  int local_30;
  xmlParserInputState oldstate;
  int count;
  xmlChar stop;
  int iStack_24;
  xmlChar cur;
  int size;
  int len;
  xmlChar *buf;
  xmlParserCtxtPtr ctxt_local;
  
  iStack_24 = 0;
  count = 100;
  local_30 = 0;
  xVar1 = ctxt->instate;
  if (((ctxt->progressive == 0) && (500 < (long)ctxt->input->cur - (long)ctxt->input->base)) &&
     ((long)ctxt->input->end - (long)ctxt->input->cur < 500)) {
    xmlSHRINK(ctxt);
  }
  if (*ctxt->input->cur == '\"') {
    xmlNextChar(ctxt);
    oldstate._2_1_ = 0x22;
  }
  else {
    if (*ctxt->input->cur != '\'') {
      xmlFatalErr(ctxt,XML_ERR_LITERAL_NOT_STARTED,(char *)0x0);
      return (xmlChar *)0x0;
    }
    xmlNextChar(ctxt);
    oldstate._2_1_ = 0x27;
  }
  _size = (xmlParserCtxtPtr)(*xmlMallocAtomic)(100);
  if (_size == (xmlParserCtxtPtr)0x0) {
    xmlErrMemory(ctxt,(char *)0x0);
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    ctxt->instate = XML_PARSER_PUBLIC_LITERAL;
    oldstate._3_1_ = *ctxt->input->cur;
    while (""[(byte)oldstate._3_1_] != '\0' && oldstate._3_1_ != oldstate._2_1_) {
      pxVar2 = _size;
      if (count <= iStack_24 + 1) {
        if ((50000 < count) && ((ctxt->options & 0x80000U) == 0)) {
          xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"Public ID");
          (*xmlFree)(_size);
          return (xmlChar *)0x0;
        }
        count = count << 1;
        pxVar2 = (xmlParserCtxtPtr)(*xmlRealloc)(_size,(long)count);
        if (pxVar2 == (xmlParserCtxtPtr)0x0) {
          xmlErrMemory(ctxt,(char *)0x0);
          (*xmlFree)(_size);
          return (xmlChar *)0x0;
        }
      }
      _size = pxVar2;
      iVar3 = iStack_24 + 1;
      *(undefined1 *)((long)&_size->sax + (long)iStack_24) = oldstate._3_1_;
      local_30 = local_30 + 1;
      if (0x32 < local_30) {
        if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
        local_30 = 0;
        if (ctxt->instate == XML_PARSER_EOF) {
          (*xmlFree)(_size);
          return (xmlChar *)0x0;
        }
      }
      xmlNextChar(ctxt);
      oldstate._3_1_ = *ctxt->input->cur;
      iStack_24 = iVar3;
      if (oldstate._3_1_ == XML_PARSER_START >> 0x18) {
        if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
        if (((ctxt->progressive == 0) && (500 < (long)ctxt->input->cur - (long)ctxt->input->base))
           && ((long)ctxt->input->end - (long)ctxt->input->cur < 500)) {
          xmlSHRINK(ctxt);
        }
        oldstate._3_1_ = *ctxt->input->cur;
      }
    }
    *(undefined1 *)((long)&_size->sax + (long)iStack_24) = 0;
    if (oldstate._3_1_ == oldstate._2_1_) {
      xmlNextChar(ctxt);
    }
    else {
      xmlFatalErr(ctxt,XML_ERR_LITERAL_NOT_FINISHED,(char *)0x0);
    }
    ctxt->instate = xVar1;
    ctxt_local = _size;
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

xmlChar *
xmlParsePubidLiteral(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    xmlChar cur;
    xmlChar stop;
    int count = 0;
    xmlParserInputState oldstate = ctxt->instate;

    SHRINK;
    if (RAW == '"') {
        NEXT;
	stop = '"';
    } else if (RAW == '\'') {
        NEXT;
	stop = '\'';
    } else {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_STARTED, NULL);
	return(NULL);
    }
    buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
    if (buf == NULL) {
	xmlErrMemory(ctxt, NULL);
	return(NULL);
    }
    ctxt->instate = XML_PARSER_PUBLIC_LITERAL;
    cur = CUR;
    while ((IS_PUBIDCHAR_CH(cur)) && (cur != stop)) { /* checked */
	if (len + 1 >= size) {
	    xmlChar *tmp;

            if ((size > XML_MAX_NAME_LENGTH) &&
                ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "Public ID");
                xmlFree(buf);
                return(NULL);
            }
	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size * sizeof(xmlChar));
	    if (tmp == NULL) {
		xmlErrMemory(ctxt, NULL);
		xmlFree(buf);
		return(NULL);
	    }
	    buf = tmp;
	}
	buf[len++] = cur;
	count++;
	if (count > 50) {
	    GROW;
	    count = 0;
            if (ctxt->instate == XML_PARSER_EOF) {
		xmlFree(buf);
		return(NULL);
            }
	}
	NEXT;
	cur = CUR;
	if (cur == 0) {
	    GROW;
	    SHRINK;
	    cur = CUR;
	}
    }
    buf[len] = 0;
    if (cur != stop) {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_FINISHED, NULL);
    } else {
	NEXT;
    }
    ctxt->instate = oldstate;
    return(buf);
}